

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core>
helics::CoreFactory::create(CoreType type,string_view coreName,int argc,char **argv)

{
  string_view message;
  string_view name;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 extraout_var;
  char *in_RCX;
  size_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  element_type *in_RDI;
  uint in_R8D;
  undefined8 in_R9;
  __sv_type _Var5;
  shared_ptr<helics::Core> sVar6;
  CoreType newType;
  string newName;
  shared_ptr<helics::Core> *core;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  RegistrationFailure *this;
  undefined7 in_stack_fffffffffffffea8;
  element_type *peVar7;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 uVar8;
  exception in_stack_fffffffffffffec7;
  undefined4 in_stack_fffffffffffffec8;
  CoreType in_stack_fffffffffffffecc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  CoreType in_stack_ffffffffffffff0c;
  shared_ptr<helics::Core> *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  size_t local_a8;
  char *local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  
  peVar7 = in_RDI;
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  std::__cxx11::string::string(in_stack_fffffffffffffea0);
  if ((in_ESI == 0x65) ||
     (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18), bVar1))
  {
    helics::core::extractCoreType_abi_cxx11_
              (in_stack_ffffffffffffff1c,(char **)in_stack_ffffffffffffff10);
    std::tie<helics::CoreType,std::__cxx11::string>
              (&in_stack_fffffffffffffe98->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe90);
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::
    pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x4fa70d);
    bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
    if ((bVar1) &&
       (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x4fa72d), !bVar1)) {
      _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe90);
      local_a8 = _Var5._M_len;
      local_18._M_len = local_a8;
      local_a0 = _Var5._M_str;
      local_18._M_str = local_a0;
    }
  }
  name._M_str = in_stack_fffffffffffffed8;
  name._M_len = (size_t)in_stack_fffffffffffffed0;
  makeCore(in_stack_fffffffffffffecc,name);
  peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x4fa7e8);
  (*peVar4->_vptr_Core[3])(peVar4,(ulong)in_R8D,in_R9);
  uVar2 = registerCore(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if ((bool)uVar2) {
    std::__cxx11::string::~string(in_stack_fffffffffffffe90);
    sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<helics::Core>)
           sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar8 = 1;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x28);
  this = (RegistrationFailure *)&stack0xfffffffffffffec7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,
             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffec7,CONCAT16(uVar8,in_stack_fffffffffffffec0)));
  peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x4fa86f);
  iVar3 = (*peVar4->_vptr_Core[0xc])();
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(extraout_var,iVar3);
  std::operator+(__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::operator_cast_to_basic_string_view(__rhs);
  message._M_len._7_1_ = uVar2;
  message._M_len._0_7_ = in_stack_fffffffffffffea8;
  message._M_str = (char *)peVar7;
  RegistrationFailure::RegistrationFailure(this,message);
  __cxa_throw(__lhs,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
}

Assistant:

std::shared_ptr<Core> create(CoreType type, std::string_view coreName, int argc, char* argv[])
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || coreName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(argc, argv);
        if (coreName.empty() && !newName.empty()) {
            coreName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto core = makeCore(type, coreName);
    core->configureFromArgs(argc, argv);
    if (!registerCore(core, type)) {
        throw(helics::RegistrationFailure(std::string("core ") + core->getIdentifier() +
                                          " failed to register properly"));
    }

    return core;
}